

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

uint32_t upb_MiniTable_GetSubList(upb_MiniTable *m,upb_MiniTableField **subs)

{
  byte bVar1;
  ushort uVar2;
  upb_MiniTableField *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = m->field_count_dont_copy_me__upb_internal_use_only;
  if (uVar2 == 0) {
    uVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar4 = 0;
    do {
      puVar3 = m->fields_dont_copy_me__upb_internal_use_only;
      bVar1 = (&puVar3->descriptortype_dont_copy_me__upb_internal_use_only)[lVar7];
      if (((&puVar3->mode_dont_copy_me__upb_internal_use_only)[lVar7] & 0x10) == 0) {
        if ((ulong)(bVar1 - 1) - 9 < 2) {
          *subs = (upb_MiniTableField *)
                  ((long)&puVar3->number_dont_copy_me__upb_internal_use_only + lVar7);
          subs = subs + 1;
          iVar4 = iVar4 + 1;
        }
      }
      else if ((bVar1 != 5) && (bVar1 != 0xc)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      lVar7 = lVar7 + 0xc;
    } while ((ulong)((uint)uVar2 * 4) * 3 != lVar7);
    uVar5 = iVar4 << 0x10;
    if (uVar2 != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        if ((&m->fields_dont_copy_me__upb_internal_use_only->
              descriptortype_dont_copy_me__upb_internal_use_only)[lVar7] == '\x0e') {
          *subs = (upb_MiniTableField *)
                  ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                          number_dont_copy_me__upb_internal_use_only + lVar7);
          subs = subs + 1;
          uVar6 = uVar6 + 1;
        }
        lVar7 = lVar7 + 0xc;
      } while ((ulong)uVar2 * 0xc != lVar7);
      goto LAB_0028fcbc;
    }
  }
  uVar6 = 0;
LAB_0028fcbc:
  return uVar5 | uVar6;
}

Assistant:

uint32_t upb_MiniTable_GetSubList(const upb_MiniTable* m,
                                  const upb_MiniTableField** subs) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      *subs = f;
      ++subs;
      msg_count++;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      *subs = f;
      ++subs;
      enum_count++;
    }
  }

  return (msg_count << 16) | enum_count;
}